

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v3::setup_ib0(xr_ogf_v3 *this)

{
  ulong uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  ulong uVar4;
  ogf3_vsplit *poVar5;
  ogf3_vsplit *poVar6;
  ulong uVar7;
  ulong uVar8;
  
  xr_ibuf::operator=(&this->m_ib0,&(this->super_xr_ogf).m_ib);
  uVar4 = (ulong)this->m_min_vertices;
  poVar5 = this->m_vsplits;
  uVar1 = (this->super_xr_ogf).m_vb.super_xr_flexbuf.m_size;
  poVar6 = poVar5 + (uVar1 - uVar4);
  if (poVar5 != poVar6) {
    puVar2 = this->m_fix_faces;
    puVar3 = (this->m_ib0).m_indices;
    uVar7 = 0;
    do {
      uVar8 = (ulong)poVar5->fix_faces;
      if (uVar7 < uVar7 + uVar8) {
        do {
          puVar3[puVar2[uVar7]] = (uint16_t)uVar4;
          uVar7 = uVar7 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      poVar5 = poVar5 + 1;
    } while (poVar5 != poVar6);
  }
  if (uVar1 == (uVar4 & 0xffff)) {
    return;
  }
  __assert_fail("active_vb_size == m_vb.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,99,"void xray_re::xr_ogf_v3::setup_ib0()");
}

Assistant:

void xr_ogf_v3::setup_ib0()
{
	m_ib0 = m_ib;
	size_t fix_idx = 0;
	uint16_t active_vb_size = uint16_t(m_min_vertices & UINT16_MAX);
	for (ogf3_vsplit *p = m_vsplits, *end = p + m_vb.size() - m_min_vertices; p != end; ++p) {
		for (uint_fast32_t end_idx = fix_idx + p->fix_faces; fix_idx < end_idx; ++fix_idx)
			m_ib0[m_fix_faces[fix_idx]] = active_vb_size;
		++active_vb_size;
	}
	assert(active_vb_size == m_vb.size());
}